

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O1

int CfdGetTaprootScriptTreeSrting(void *handle,void *tree_handle,char **tree_string)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  TapBranch *this;
  char *pcVar3;
  string tree_str;
  string local_60;
  string local_40;
  
  cfd::Initialize();
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"TapscriptTree","");
  cfd::capi::CheckBuffer(tree_handle,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  plVar2 = *(long **)((long)tree_handle + 0x18);
  if (*plVar2 == plVar2[1]) {
    this = (TapBranch *)**(undefined8 **)((long)tree_handle + 0x10);
    if ((TapBranch *)(*(undefined8 **)((long)tree_handle + 0x10))[1] == this) {
      local_60._M_dataplus._M_p = (pointer)paVar1;
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    local_60._M_dataplus._M_p = (pointer)paVar1;
    cfd::core::TapBranch::ToString_abi_cxx11_(&local_40,this);
  }
  else {
    if ((TapBranch *)plVar2[1] == (TapBranch *)*plVar2) {
      local_60._M_dataplus._M_p = (pointer)paVar1;
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    local_60._M_dataplus._M_p = (pointer)paVar1;
    cfd::core::TapBranch::ToString_abi_cxx11_(&local_40,(TapBranch *)*plVar2);
  }
  std::__cxx11::string::operator=((string *)&local_60,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (tree_string != (char **)0x0) {
    pcVar3 = cfd::capi::CreateString(&local_60);
    *tree_string = pcVar3;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int CfdGetTaprootScriptTreeSrting(
    void* handle, void* tree_handle, char** tree_string) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    std::string tree_str;
    if (!buffer->branch_buffer->empty()) {
      tree_str = buffer->branch_buffer->at(0).ToString();
    } else {
      tree_str = buffer->tree_buffer->at(0).ToString();
    }

    if (tree_string != nullptr) {
      *tree_string = CreateString(tree_str);
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}